

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

Type __thiscall Parse::toType(Parse *this,string *basic_string)

{
  code *pcVar1;
  bool bVar2;
  string *basic_string_local;
  Parse *this_local;
  
  bVar2 = std::operator==(basic_string,"int");
  if (bVar2) {
    this_local._4_4_ = INT;
  }
  else {
    bVar2 = std::operator==(basic_string,"bool");
    if (bVar2) {
      this_local._4_4_ = BOOL;
    }
    else {
      bVar2 = std::operator==(basic_string,"float");
      if ((!bVar2) && (bVar2 = std::operator==(basic_string,"double"), !bVar2)) {
        bVar2 = std::operator==(basic_string,"char");
        if (bVar2) {
          return CHAR;
        }
        bVar2 = std::operator==(basic_string,"arr");
        if (bVar2) {
          return ARRAY;
        }
        bVar2 = std::operator==(basic_string,"string");
        if (bVar2) {
          return STRING;
        }
        bVar2 = std::operator==(basic_string,"void");
        if (bVar2) {
          return VOID;
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      this_local._4_4_ = DOUBLE;
    }
  }
  return this_local._4_4_;
}

Assistant:

Type Parse::toType(string basic_string) {
    if(basic_string == "int") {
        return Type::INT;
    } else if(basic_string == "bool") {
        return Type::BOOL;
    } else if(basic_string == "float" || basic_string == "double") {
        return Type ::DOUBLE;
    } else if(basic_string == "char") {
        return Type ::CHAR;
    } else if(basic_string == "arr") {
        return Type ::ARRAY;
    } else if(basic_string == "string") {
        return Type::STRING;
    } else if(basic_string == "void") {
        return Type::VOID;
    }
}